

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::IfExpr::~IfExpr(IfExpr *this)

{
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExpr_0024a8d8;
  intrusive_list<wabt::Expr>::clear(&this->false_);
  Block::~Block(&this->true_);
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}